

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O0

void __thiscall
bloaty::RangeMapTest_Bug1_Test::~RangeMapTest_Bug1_Test(RangeMapTest_Bug1_Test *this)

{
  void *in_RDI;
  
  ~RangeMapTest_Bug1_Test((RangeMapTest_Bug1_Test *)0x183118);
  operator_delete(in_RDI,0xb0);
  return;
}

Assistant:

TEST_F(RangeMapTest, Bug1) {
  map_.AddRange(100, 20, "foo");
  map_.AddRange(120, 20, "bar");
  map_.AddRange(100, 15, "baz");
  AssertMainMapEquals({
    {100, 120, kNoTranslation, "foo"},
    {120, 140, kNoTranslation, "bar"},
  });
}